

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void dirty_index_consistency_test(void)

{
  fdb_status fVar1;
  char valuebuf [256];
  char keybuf [256];
  fdb_status s;
  fdb_doc *rdoc;
  fdb_doc *doc;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_iterator *fit;
  fdb_kvs_handle *db [2];
  fdb_file_handle *dbfile;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffb38;
  fdb_iterator *iterator;
  void *in_stack_fffffffffffffb40;
  fdb_iterator *in_stack_fffffffffffffb48;
  void *in_stack_fffffffffffffb50;
  fdb_doc **in_stack_fffffffffffffb58;
  undefined1 local_4a0 [16];
  size_t in_stack_fffffffffffffb70;
  fdb_doc **in_stack_fffffffffffffbb0;
  fdb_iterator *in_stack_fffffffffffffbb8;
  char local_3a8 [136];
  fdb_kvs_config *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  fdb_kvs_handle **in_stack_fffffffffffffcf0;
  fdb_file_handle *in_stack_fffffffffffffcf8;
  fdb_config *in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  fdb_file_handle **in_stack_fffffffffffffd68;
  fdb_doc *local_198;
  undefined1 local_178 [8];
  undefined8 local_170;
  undefined8 local_168;
  fdb_iterator *local_80;
  fdb_kvs_handle *local_78;
  fdb_kvs_handle *local_70;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_58 = system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_178,local_4a0,0xf8);
  local_170 = 0;
  local_168 = 100;
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12bb);
    dirty_index_consistency_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12bb,"void dirty_index_consistency_test()");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8
                       ,in_stack_fffffffffffffce0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12be);
    dirty_index_consistency_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12be,"void dirty_index_consistency_test()");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8
                       ,in_stack_fffffffffffffce0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12c1);
    dirty_index_consistency_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12c1,"void dirty_index_consistency_test()");
    }
  }
  memset(&stack0xfffffffffffffd58,0,0x100);
  memset(local_3a8,0,0x100);
  for (local_54 = 0; (int)local_54 < 1000; local_54 = local_54 + 1) {
    sprintf(&stack0xfffffffffffffd58,"k%06d",(ulong)local_54);
    sprintf(local_3a8,"v%06d",(ulong)local_54);
    in_stack_fffffffffffffb38 = (fdb_file_handle *)0x9;
    fdb_doc_create(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                   (size_t)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,9,(void *)0x11e560,
                   in_stack_fffffffffffffb70);
    fVar1 = fdb_set(local_70,local_198);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x12cc);
      dirty_index_consistency_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x12cc,"void dirty_index_consistency_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x11e5ee);
  }
  for (local_54 = 0; (int)local_54 < 1000; local_54 = local_54 + 1) {
    sprintf(&stack0xfffffffffffffd58,"k%06d",(ulong)local_54);
    in_stack_fffffffffffffb38 = (fdb_file_handle *)0x9;
    fdb_doc_create(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                   (size_t)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,9,(void *)0x11e66f,
                   in_stack_fffffffffffffb70);
    fVar1 = fdb_get(local_78,local_198);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x12d5);
      dirty_index_consistency_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x12d5,"void dirty_index_consistency_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x11e6fd);
  }
  for (local_54 = 1000; (int)local_54 < 3000; local_54 = local_54 + 1) {
    sprintf(&stack0xfffffffffffffd58,"k%06d",(ulong)local_54);
    sprintf(local_3a8,"v%06d",(ulong)local_54);
    in_stack_fffffffffffffb38 = (fdb_file_handle *)0x9;
    fdb_doc_create(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                   (size_t)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,9,(void *)0x11e79b,
                   in_stack_fffffffffffffb70);
    fVar1 = fdb_set(local_70,local_198);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x12e0);
      dirty_index_consistency_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x12e0,"void dirty_index_consistency_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x11e829);
  }
  fVar1 = fdb_commit(in_stack_fffffffffffffb38,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12e6);
    dirty_index_consistency_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12e6,"void dirty_index_consistency_test()");
    }
  }
  iterator = (fdb_iterator *)((ulong)in_stack_fffffffffffffb38 & 0xffffffff00000000);
  fVar1 = fdb_iterator_init(local_70,&local_80,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12ea);
    dirty_index_consistency_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12ea,"void dirty_index_consistency_test()");
    }
  }
  local_58 = 0;
  do {
    fVar1 = fdb_iterator_get(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    local_58 = local_58 + 1;
    fdb_doc_free((fdb_doc *)0x11e9b2);
    fVar1 = fdb_iterator_next(iterator);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  fdb_iterator_close(in_stack_fffffffffffffb48);
  if (local_58 != 3000) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12f5);
    dirty_index_consistency_test::__test_pass = 0;
    if (local_58 != 3000) {
      __assert_fail("r == 3000",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12f5,"void dirty_index_consistency_test()");
    }
  }
  fVar1 = fdb_close((fdb_file_handle *)iterator);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x12f8);
    dirty_index_consistency_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x12f8,"void dirty_index_consistency_test()");
    }
  }
  fdb_shutdown();
  memleak_end();
  if (dirty_index_consistency_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","dirty index consistency test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","dirty index consistency test");
  }
  return;
}

Assistant:

void dirty_index_consistency_test()
{
    TEST_INIT();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db[2];
    fdb_iterator *fit;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc, *rdoc;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256];

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.wal_threshold = 100;
    kvs_config = fdb_get_default_kvs_config();

    // create a file
    s = fdb_open(&dbfile, "dummy", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[0], NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[1], NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(keybuf, 0x0, 256);
    memset(valuebuf, 0x0, 256);

    // insert docs & dirty WAL flushing
    for (i=0; i<1000; i++) {
        sprintf(keybuf, "k%06d", i);
        sprintf(valuebuf, "v%06d", i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 9);
        s = fdb_set(db[1], doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }

    // get docks
    for (i=0; i<1000; i++) {
        sprintf(keybuf, "k%06d", i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 9);
        s = fdb_get(db[0], doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    // now dirty blocks are cached in db[0]'s (default) bhandle

    // more dirty WAL flushing
    for (i=1000; i<3000; i++) {
        sprintf(keybuf, "k%06d", i);
        sprintf(valuebuf, "v%06d", i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 9);
        s = fdb_set(db[1], doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }

    // commit - WAL flushing is executed on the default handle
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // count # docs
    s = fdb_iterator_init(db[1], &fit, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    r = 0;
    do {
        rdoc = NULL;
        s = fdb_iterator_get(fit, &rdoc);
        if (s != FDB_RESULT_SUCCESS) break;
        r++;
        fdb_doc_free(rdoc);
    } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(fit);

    TEST_CHK(r == 3000);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("dirty index consistency test");
}